

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLFeeder_Easy::FillObjNonzeros(NLFeeder_Easy *this)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  NLModel *pNVar1;
  double *pdVar2;
  int iVar3;
  NLFeeder_Easy *in_RDI;
  bool bVar4;
  double dVar5;
  iterator iVar6;
  size_t pos;
  int i_1;
  size_t pos_end;
  NLW2_SparseMatrix_C Q;
  int i;
  NLModel *in_stack_ffffffffffffff20;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *__init;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff4c;
  reference local_80;
  reference local_70;
  vector<bool,_std::allocator<bool>_> *local_60;
  int local_54;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 __x;
  size_type in_stack_ffffffffffffffb8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  long local_38;
  reference local_20;
  int local_c;
  
  __x = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  __init = &in_RDI->obj_grad_supp_;
  pNVar1 = NLME(in_RDI);
  NLModel::NumCols(pNVar1);
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)__x);
  pNVar1 = NLME(in_RDI);
  pdVar2 = NLModel::ObjCoefficients(pNVar1);
  if (pdVar2 != (double *)0x0) {
    pNVar1 = NLME(in_RDI);
    local_c = NLModel::NumCols(pNVar1);
    while (iVar3 = local_c + -1, bVar4 = local_c != 0, local_c = iVar3, bVar4) {
      pNVar1 = NLME(in_RDI);
      pdVar2 = NLModel::ObjCoefficients(pNVar1);
      dVar5 = pdVar2[local_c];
      local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_ffffffffffffff40,(size_type)in_RDI);
      std::_Bit_reference::operator=(&local_20,dVar5 != 0.0);
    }
  }
  NLME(in_RDI);
  NLModel::Hessian(in_stack_ffffffffffffff20);
  if (in_stack_ffffffffffffffc0 != (vector<bool,_std::allocator<bool>_> *)0x0) {
    pNVar1 = NLME(in_RDI);
    local_54 = NLModel::NumCols(pNVar1);
    while (iVar3 = local_54 + -1, bVar4 = local_54 != 0, local_54 = iVar3, bVar4) {
      for (local_60 = *(vector<bool,_std::allocator<bool>_> **)(local_38 + (long)iVar3 * 8);
          local_60 != in_stack_ffffffffffffffc0;
          local_60 = (vector<bool,_std::allocator<bool>_> *)
                     ((long)&(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
        local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_ffffffffffffff40,(size_type)in_RDI);
        std::_Bit_reference::operator=(&local_70,true);
        local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_ffffffffffffff40,(size_type)in_RDI);
        std::_Bit_reference::operator=(&local_80,true);
      }
      in_stack_ffffffffffffffc0 =
           *(vector<bool,_std::allocator<bool>_> **)(local_38 + (long)local_54 * 8);
    }
  }
  this_00 = &in_RDI->obj_grad_supp_;
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x125884);
  iVar6 = std::vector<bool,_std::allocator<bool>_>::end(this_00);
  __first.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff4c;
  __first.super__Bit_iterator_base._M_p._0_4_ = iVar6.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._8_8_ = iVar6.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._8_8_ = iVar6.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)in_RDI;
  dVar5 = std::accumulate<std::_Bit_iterator,double>(__first,__last,(double)__init);
  (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros =
       (long)dVar5 | (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f;
  return;
}

Assistant:

void FillObjNonzeros() {
    obj_grad_supp_.resize(NLME().NumCols());
    // Linear part -- if provided
    if (NLME().ObjCoefficients()) {
      for (auto i=NLME().NumCols(); i--; )
        obj_grad_supp_[i] = (NLME().ObjCoefficients()[i]);
    }
    // QP part
    auto Q = NLME().Hessian();
    if (Q.num_nz_) {
      assert(Q.num_colrow_ == NLME().NumCols());
      auto pos_end = Q.num_nz_;
      for (auto i=NLME().NumCols(); i--; ) {
        for (auto pos=Q.start_[i]; pos!=pos_end; ++pos) {
          obj_grad_supp_[i] = true;             // x
          obj_grad_supp_[Q.index_[pos]] = true; // y
        }
        pos_end = Q.start_[i];
      }
    }
    header_.num_obj_nonzeros
        = std::accumulate(obj_grad_supp_.begin(),
                          obj_grad_supp_.end(), 0.0);
  }